

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlatformUtility.cpp
# Opt level: O0

string * llbuild::basic::sys::makeTmpDir_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  allocator local_39;
  char local_38 [8];
  char tmpDirPathBuf [16];
  char *local_20;
  char *tmpDirPath;
  char *tmpDir;
  string *tmpDirString;
  
  tmpDirPath = getenv("TMPDIR");
  if (tmpDirPath == (char *)0x0) {
    builtin_strncpy(local_38,"/tmp/fil",8);
    builtin_strncpy(tmpDirPathBuf,"eXXXXXX",8);
    pcVar1 = mkdtemp(local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    local_20 = (char *)0x0;
    asprintf(&local_20,"%s/fileXXXXXX",tmpDirPath);
    tmpDirPathBuf[0xf] = '\0';
    pcVar1 = mkdtemp(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,(allocator *)(tmpDirPathBuf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(tmpDirPathBuf + 0xe));
    free(local_20);
  }
  return in_RDI;
}

Assistant:

std::string sys::makeTmpDir() {
#if defined(_WIN32)
  char path[MAX_PATH];
  tmpnam_s(path, MAX_PATH);
  llvm::SmallVector<llvm::UTF16, 20> wPath;
  llvm::convertUTF8ToUTF16String(path, wPath);
  CreateDirectoryW((LPCWSTR)wPath.data(), NULL);
  return std::string(path);
#else
  if (const char *tmpDir = std::getenv("TMPDIR")) {
    char *tmpDirPath = nullptr;
    asprintf(&tmpDirPath, "%s/fileXXXXXX", tmpDir);
    auto tmpDirString = std::string(mkdtemp(tmpDirPath));
    free(tmpDirPath);
    return tmpDirString;
  }
  else {
    char tmpDirPathBuf[] = "/tmp/fileXXXXXX";
    return std::string(mkdtemp(tmpDirPathBuf));
  }
#endif
}